

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_code_options.c
# Opt level: O1

int check_bps(test_state *state)

{
  aec_stream *paVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  
  iVar4 = -5;
  uVar5 = 8;
  do {
    paVar1 = state->strm;
    paVar1->bits_per_sample = uVar5;
    paVar1->flags = (paVar1->flags & 0xfffffffd) + (uint)(uVar5 == 0x18) * 2;
    update_state(state);
    iVar2 = check_zero(state);
    if ((((iVar2 != 0) || (iVar2 = check_se(state), iVar2 != 0)) ||
        (iVar2 = check_uncompressed(state), iVar2 != 0)) || (iVar2 = check_fs(state), iVar2 != 0)) {
      return iVar2;
    }
    iVar2 = 1;
    do {
      iVar3 = check_splitting(state,iVar2);
      if (iVar3 != 0) {
        return iVar3;
      }
      iVar3 = iVar2 + iVar4;
      iVar2 = iVar2 + 1;
    } while (iVar3 != 0);
    printf("All checks with %i bit per sample passed.\n",(ulong)uVar5);
    iVar4 = iVar4 + -8;
    bVar6 = uVar5 < 0x19;
    uVar5 = uVar5 + 8;
  } while (bVar6);
  return 0;
}

Assistant:

int check_bps(struct test_state *state)
{
    int k, status, bps;

    for (bps = 8; bps <= 32; bps += 8) {
        state->strm->bits_per_sample = bps;
        if (bps == 24)
            state->strm->flags |= AEC_DATA_3BYTE;
        else
            state->strm->flags &= ~AEC_DATA_3BYTE;

        update_state(state);

        status = check_zero(state);
        if (status)
            return status;

        status = check_se(state);
        if (status)
            return status;

        status = check_uncompressed(state);
        if (status)
            return status;

        status = check_fs(state);
        if (status)
            return status;

        for (k = 1; k < bps - 2; k++) {
            status = check_splitting(state, k);
            if (status)
                return status;
        }
        printf("All checks with %i bit per sample passed.\n", bps);
    }
    return 0;
}